

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.h
# Opt level: O0

map<jsonnet::internal::BinaryOp,_int,_std::less<jsonnet::internal::BinaryOp>,_std::allocator<std::pair<const_jsonnet::internal::BinaryOp,_int>_>_>
* jsonnet::internal::anon_unknown_0::build_precedence_map(void)

{
  mapped_type *pmVar1;
  map<jsonnet::internal::BinaryOp,_int,_std::less<jsonnet::internal::BinaryOp>,_std::allocator<std::pair<const_jsonnet::internal::BinaryOp,_int>_>_>
  *this;
  key_type *__k;
  map<jsonnet::internal::BinaryOp,_int,_std::less<jsonnet::internal::BinaryOp>,_std::allocator<std::pair<const_jsonnet::internal::BinaryOp,_int>_>_>
  *in_RDI;
  map<jsonnet::internal::BinaryOp,_int,_std::less<jsonnet::internal::BinaryOp>,_std::allocator<std::pair<const_jsonnet::internal::BinaryOp,_int>_>_>
  *r;
  key_type *in_stack_ffffffffffffff28;
  map<jsonnet::internal::BinaryOp,_int,_std::less<jsonnet::internal::BinaryOp>,_std::allocator<std::pair<const_jsonnet::internal::BinaryOp,_int>_>_>
  *in_stack_ffffffffffffff30;
  
  std::
  map<jsonnet::internal::BinaryOp,_int,_std::less<jsonnet::internal::BinaryOp>,_std::allocator<std::pair<const_jsonnet::internal::BinaryOp,_int>_>_>
  ::map((map<jsonnet::internal::BinaryOp,_int,_std::less<jsonnet::internal::BinaryOp>,_std::allocator<std::pair<const_jsonnet::internal::BinaryOp,_int>_>_>
         *)0x2b836f);
  pmVar1 = std::
           map<jsonnet::internal::BinaryOp,_int,_std::less<jsonnet::internal::BinaryOp>,_std::allocator<std::pair<const_jsonnet::internal::BinaryOp,_int>_>_>
           ::operator[](in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
  *pmVar1 = 5;
  pmVar1 = std::
           map<jsonnet::internal::BinaryOp,_int,_std::less<jsonnet::internal::BinaryOp>,_std::allocator<std::pair<const_jsonnet::internal::BinaryOp,_int>_>_>
           ::operator[](in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
  *pmVar1 = 5;
  pmVar1 = std::
           map<jsonnet::internal::BinaryOp,_int,_std::less<jsonnet::internal::BinaryOp>,_std::allocator<std::pair<const_jsonnet::internal::BinaryOp,_int>_>_>
           ::operator[](in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
  *pmVar1 = 5;
  pmVar1 = std::
           map<jsonnet::internal::BinaryOp,_int,_std::less<jsonnet::internal::BinaryOp>,_std::allocator<std::pair<const_jsonnet::internal::BinaryOp,_int>_>_>
           ::operator[](in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
  *pmVar1 = 6;
  pmVar1 = std::
           map<jsonnet::internal::BinaryOp,_int,_std::less<jsonnet::internal::BinaryOp>,_std::allocator<std::pair<const_jsonnet::internal::BinaryOp,_int>_>_>
           ::operator[](in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
  *pmVar1 = 6;
  pmVar1 = std::
           map<jsonnet::internal::BinaryOp,_int,_std::less<jsonnet::internal::BinaryOp>,_std::allocator<std::pair<const_jsonnet::internal::BinaryOp,_int>_>_>
           ::operator[](in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
  *pmVar1 = 7;
  pmVar1 = std::
           map<jsonnet::internal::BinaryOp,_int,_std::less<jsonnet::internal::BinaryOp>,_std::allocator<std::pair<const_jsonnet::internal::BinaryOp,_int>_>_>
           ::operator[](in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
  *pmVar1 = 7;
  pmVar1 = std::
           map<jsonnet::internal::BinaryOp,_int,_std::less<jsonnet::internal::BinaryOp>,_std::allocator<std::pair<const_jsonnet::internal::BinaryOp,_int>_>_>
           ::operator[](in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
  *pmVar1 = 8;
  pmVar1 = std::
           map<jsonnet::internal::BinaryOp,_int,_std::less<jsonnet::internal::BinaryOp>,_std::allocator<std::pair<const_jsonnet::internal::BinaryOp,_int>_>_>
           ::operator[](in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
  *pmVar1 = 8;
  pmVar1 = std::
           map<jsonnet::internal::BinaryOp,_int,_std::less<jsonnet::internal::BinaryOp>,_std::allocator<std::pair<const_jsonnet::internal::BinaryOp,_int>_>_>
           ::operator[](in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
  *pmVar1 = 8;
  this = (map<jsonnet::internal::BinaryOp,_int,_std::less<jsonnet::internal::BinaryOp>,_std::allocator<std::pair<const_jsonnet::internal::BinaryOp,_int>_>_>
          *)std::
            map<jsonnet::internal::BinaryOp,_int,_std::less<jsonnet::internal::BinaryOp>,_std::allocator<std::pair<const_jsonnet::internal::BinaryOp,_int>_>_>
            ::operator[](in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
  *(undefined4 *)&(this->_M_t)._M_impl = 8;
  __k = (key_type *)
        std::
        map<jsonnet::internal::BinaryOp,_int,_std::less<jsonnet::internal::BinaryOp>,_std::allocator<std::pair<const_jsonnet::internal::BinaryOp,_int>_>_>
        ::operator[](this,in_stack_ffffffffffffff28);
  *__k = BOP_GREATER_EQ;
  pmVar1 = std::
           map<jsonnet::internal::BinaryOp,_int,_std::less<jsonnet::internal::BinaryOp>,_std::allocator<std::pair<const_jsonnet::internal::BinaryOp,_int>_>_>
           ::operator[](this,__k);
  *pmVar1 = 9;
  pmVar1 = std::
           map<jsonnet::internal::BinaryOp,_int,_std::less<jsonnet::internal::BinaryOp>,_std::allocator<std::pair<const_jsonnet::internal::BinaryOp,_int>_>_>
           ::operator[](this,__k);
  *pmVar1 = 9;
  pmVar1 = std::
           map<jsonnet::internal::BinaryOp,_int,_std::less<jsonnet::internal::BinaryOp>,_std::allocator<std::pair<const_jsonnet::internal::BinaryOp,_int>_>_>
           ::operator[](this,__k);
  *pmVar1 = 10;
  pmVar1 = std::
           map<jsonnet::internal::BinaryOp,_int,_std::less<jsonnet::internal::BinaryOp>,_std::allocator<std::pair<const_jsonnet::internal::BinaryOp,_int>_>_>
           ::operator[](this,__k);
  *pmVar1 = 0xb;
  pmVar1 = std::
           map<jsonnet::internal::BinaryOp,_int,_std::less<jsonnet::internal::BinaryOp>,_std::allocator<std::pair<const_jsonnet::internal::BinaryOp,_int>_>_>
           ::operator[](this,__k);
  *pmVar1 = 0xc;
  pmVar1 = std::
           map<jsonnet::internal::BinaryOp,_int,_std::less<jsonnet::internal::BinaryOp>,_std::allocator<std::pair<const_jsonnet::internal::BinaryOp,_int>_>_>
           ::operator[](this,__k);
  *pmVar1 = 0xd;
  pmVar1 = std::
           map<jsonnet::internal::BinaryOp,_int,_std::less<jsonnet::internal::BinaryOp>,_std::allocator<std::pair<const_jsonnet::internal::BinaryOp,_int>_>_>
           ::operator[](this,__k);
  *pmVar1 = 0xe;
  return in_RDI;
}

Assistant:

std::map<BinaryOp, int> build_precedence_map(void)
{
    std::map<BinaryOp, int> r;

    r[BOP_MULT] = 5;
    r[BOP_DIV] = 5;
    r[BOP_PERCENT] = 5;

    r[BOP_PLUS] = 6;
    r[BOP_MINUS] = 6;

    r[BOP_SHIFT_L] = 7;
    r[BOP_SHIFT_R] = 7;

    r[BOP_GREATER] = 8;
    r[BOP_GREATER_EQ] = 8;
    r[BOP_LESS] = 8;
    r[BOP_LESS_EQ] = 8;
    r[BOP_IN] = 8;

    r[BOP_MANIFEST_EQUAL] = 9;
    r[BOP_MANIFEST_UNEQUAL] = 9;

    r[BOP_BITWISE_AND] = 10;

    r[BOP_BITWISE_XOR] = 11;

    r[BOP_BITWISE_OR] = 12;

    r[BOP_AND] = 13;

    r[BOP_OR] = 14;

    return r;
}